

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# framework.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  ulong uVar3;
  element_type *peVar4;
  string local_90;
  __shared_ptr_access<test_fixture,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_70;
  shared_ptr<test_fixture> *tf;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<test_fixture>,_std::allocator<std::shared_ptr<test_fixture>_>_> *__range1;
  bool something_failed;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string fixture_name;
  char **argv_local;
  int argc_local;
  
  fixture_name.field_2._8_8_ = argv;
  std::set_terminate(handle_terminate);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_38,"",&local_39);
  std::allocator<char>::~allocator(&local_39);
  if (1 < argc) {
    std::__cxx11::string::operator=((string *)local_38,*(char **)(fixture_name.field_2._8_8_ + 8));
  }
  bVar1 = false;
  __end1 = std::
           vector<std::shared_ptr<test_fixture>,_std::allocator<std::shared_ptr<test_fixture>_>_>::
           begin(&_test_fixtures);
  tf = (shared_ptr<test_fixture> *)
       std::vector<std::shared_ptr<test_fixture>,_std::allocator<std::shared_ptr<test_fixture>_>_>::
       end(&_test_fixtures);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::shared_ptr<test_fixture>_*,_std::vector<std::shared_ptr<test_fixture>,_std::allocator<std::shared_ptr<test_fixture>_>_>_>
                                *)&tf);
    if (!bVar2) {
      if (bVar1) {
        printf("\nFailure.\n");
        system("/bin/bash -c \'read -p \"Press Any Key\"\'");
      }
      else {
        printf("\nSuccess.\n");
      }
      std::__cxx11::string::~string((string *)local_38);
      return 0;
    }
    local_70 = (__shared_ptr_access<test_fixture,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               __gnu_cxx::
               __normal_iterator<std::shared_ptr<test_fixture>_*,_std::vector<std::shared_ptr<test_fixture>,_std::allocator<std::shared_ptr<test_fixture>_>_>_>
               ::operator*(&__end1);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      peVar4 = std::__shared_ptr_access<test_fixture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_70);
      test_fixture::get_name_abi_cxx11_(&local_90,peVar4);
      bVar2 = std::operator!=(&local_90,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_38);
      std::__cxx11::string::~string((string *)&local_90);
      if (!bVar2) goto LAB_00103f11;
    }
    else {
LAB_00103f11:
      peVar4 = std::__shared_ptr_access<test_fixture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_70);
      test_fixture::run_tests(peVar4);
      peVar4 = std::__shared_ptr_access<test_fixture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->(local_70);
      bVar2 = test_fixture::something_failed(peVar4);
      if (bVar2) {
        bVar1 = true;
        peVar4 = std::__shared_ptr_access<test_fixture,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->(local_70);
        test_fixture::print_failures(peVar4);
      }
    }
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<test_fixture>_*,_std::vector<std::shared_ptr<test_fixture>,_std::allocator<std::shared_ptr<test_fixture>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

int main( int argc, char* argv[] )
{
    set_terminate( handle_terminate );

    std::string fixture_name = "";

    if( argc > 1 )
        fixture_name = argv[1];

#ifdef IS_WINDOWS
    srand( (unsigned int)GetSystemTimeAsUnixTime() );
#endif
#ifdef IS_LINUX
    srand( time(0) );
#endif

    bool something_failed = false;

    for(auto& tf : _test_fixtures)
    {
        if( !fixture_name.empty() )
            if(tf->get_name() != fixture_name )
                continue;

        tf->run_tests();

        if( tf->something_failed() )
        {
            something_failed = true;
            tf->print_failures();
        }
    }

    if( !something_failed )
        printf("\nSuccess.\n");
    else printf("\nFailure.\n");

    if(something_failed)
        system("/bin/bash -c 'read -p \"Press Any Key\"'");

    return 0;
}